

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O3

char FIX::CharConvertor::convert(string *value)

{
  FieldConvertError *this;
  
  if (value->_M_string_length == 1) {
    return *(value->_M_dataplus)._M_p;
  }
  this = (FieldConvertError *)__cxa_allocate_exception(0x50);
  FieldConvertError::FieldConvertError(this,value);
  __cxa_throw(this,&FieldConvertError::typeinfo,FIX::Exception::~Exception);
}

Assistant:

static char convert( const std::string& value )
  EXCEPT ( FieldConvertError )
  {
    char result = '\0';
    if( !convert( value, result ) )
      throw FieldConvertError(value);
    else
      return result;
  }